

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O1

void updtMem2(FOCC_CTA *foccOta,int mTid)

{
  long *plVar1;
  FILE *__stream;
  FOCC_CTA *this;
  uint uVar2;
  char cVar3;
  uint tid;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  pthread_t pVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  int locVal;
  time_t exitTime;
  time_t enterTime;
  char buf [40];
  uint local_98;
  uint local_94;
  FOCC_CTA *local_90;
  long local_88;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  long local_70;
  long local_68;
  long local_60;
  char local_58 [40];
  
  if (0 < glb::numTrans) {
    local_70 = (long)mTid;
    local_80 = 0;
    local_90 = foccOta;
    do {
      local_68 = std::chrono::_V2::system_clock::now();
      uVar9 = 0;
      do {
        local_7c = (int)uVar9;
        tid = FOCC_CTA::begin_trans(local_90);
        iVar4 = rand();
        if (-1 < iVar4 % glb::M) {
          iVar4 = iVar4 % glb::M + 1;
          local_94 = tid;
          do {
            local_74 = iVar4;
            iVar4 = rand();
            lVar8 = (long)glb::M;
            local_78 = (uint)((long)iVar4 % lVar8);
            iVar5 = rand();
            this = local_90;
            iVar5 = iVar5 % glb::constVal;
            FOCC_CTA::read(local_90,local_94,(void *)((long)iVar4 % lVar8 & 0xffffffff),
                           (size_t)&local_98);
            local_88 = std::chrono::_V2::system_clock::now();
            local_88 = local_88 / 1000000000;
            ptVar6 = localtime(&local_88);
            strftime(local_58,0x28,"%H:%M:%S",ptVar6);
            __stream = glb::log_file;
            pVar7 = pthread_self();
            uVar2 = local_78;
            fprintf(__stream,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n",
                    pVar7,(ulong)local_94,(ulong)local_78,(ulong)local_98,local_58);
            local_98 = iVar5 + local_98;
            FOCC_CTA::write(this,local_94,(void *)(ulong)uVar2,(ulong)local_98);
            local_60 = std::chrono::_V2::system_clock::now();
            local_60 = local_60 / 1000000000;
            ptVar6 = localtime(&local_60);
            strftime(local_58,0x28,"%H:%M:%S",ptVar6);
            tid = local_94;
            fprintf(glb::log_file,
                    "Thread ID %ld Transaction %d writes to %d a value %d at time %s\n",pVar7,
                    (ulong)local_94,(ulong)uVar2,(ulong)local_98,local_58);
            dVar10 = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                               ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)&glb::generator);
            dVar10 = log(1.0 - dVar10);
            usleep((__useconds_t)(long)((dVar10 / glb::dist) * -1000.0));
            iVar4 = local_74 + -1;
          } while (iVar4 != 0);
        }
        cVar3 = FOCC_CTA::tryC(local_90,tid);
        local_88 = std::chrono::_V2::system_clock::now();
        local_88 = local_88 / 1000000000;
        ptVar6 = localtime(&local_88);
        strftime(local_58,0x28,"%H:%M:%S",ptVar6);
        fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n",(ulong)tid,
                (ulong)(uint)(int)cVar3,local_58);
        uVar9 = (ulong)(local_7c + (uint)(cVar3 == 'a'));
      } while (cVar3 != 'c');
      lVar8 = std::chrono::_V2::system_clock::now();
      plVar1 = (long *)(glb::total_delay + local_70 * 8);
      *plVar1 = *plVar1 + (lVar8 - local_68) / 1000000;
      plVar1 = (long *)(glb::total_aborts + local_70 * 8);
      *plVar1 = *plVar1 + uVar9;
      local_80 = local_80 + 1;
    } while (local_80 < glb::numTrans);
  }
  return;
}

Assistant:

void updtMem2(FOCC_CTA* foccOta, int mTid){
    int abortCnt = 0;
    char status = glb::TRANS_ABORT;

    char buf[40];
    // each thread invokes numTrans Transactions!
    for(int curTrans=0; curTrans<glb::numTrans; curTrans++){
        abortCnt = 0;
        auto start = high_resolution_clock::now();
        do {
            int id = foccOta->begin_trans();
            int nItr = rand()%glb::M + 1;

            int locVal;

            for(int i=0; i<nItr; i++){
                // rnadom index to be updated.
                int randInd = rand()%glb::M;
                int randVal = rand()%glb::constVal;

                foccOta->read(id, randInd, &locVal);

                auto _reqTime = std::chrono::system_clock::now();
                time_t reqTime = std::chrono::system_clock::to_time_t(_reqTime);
                struct tm* tinfo= localtime(&reqTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
                fprintf(glb::log_file,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                locVal+=randVal;

                foccOta->write(id, randInd, locVal);

                auto _enterTime = std::chrono::system_clock::now(); //the timepoint
                auto enterTime = std::chrono::system_clock::to_time_t(_enterTime);
                tinfo= localtime(&enterTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);

                fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                usleep(1000*glb::dist(glb::generator));
            }

            status = foccOta->tryC(id);

            auto _exitTime = std::chrono::system_clock::now(); //the timepoint
            auto exitTime = std::chrono::system_clock::to_time_t(_exitTime);
            struct tm* tinfo= localtime(&exitTime);
            strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
            fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n", id, status, buf);
            //fprintf(stdout,"Transaction %d tryCommits with result %c\n", id, status);

            if(status == glb::TRANS_ABORT) {abortCnt++;}

        } while(status!=glb::TRANS_COMMIT);

        auto time_to_commit = duration_cast<milliseconds>(high_resolution_clock::now() - start);
        glb::total_delay[mTid]+=time_to_commit.count();
        glb::total_aborts[mTid]+=abortCnt;
    } // for
}